

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall kj::anon_unknown_31::WebSocketPipeImpl::~WebSocketPipeImpl(WebSocketPipeImpl *this)

{
  Fault f;
  Fault local_18;
  
  if (((this->state).ptr != (WebSocket *)0x0) && ((this->ownState).ptr == (WebSocket *)0x0)) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[86]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xa0a,FAILED,"state == nullptr || ownState.get() != nullptr",
               "\"destroying WebSocketPipe with operation still in-progress; probably going to segfault\""
               ,(char (*) [86])
                "destroying WebSocketPipe with operation still in-progress; probably going to segfault"
              );
    _::Debug::Fault::~Fault(&local_18);
  }
  _::NullableValue<kj::ForkedPromise<void>_>::~NullableValue(&(this->abortedPromise).ptr);
  Own<kj::PromiseFulfiller<void>_>::dispose(&(this->abortedFulfiller).ptr);
  Own<kj::WebSocket>::dispose(&this->ownState);
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~WebSocketPipeImpl() noexcept(false) {
    KJ_REQUIRE(state == nullptr || ownState.get() != nullptr,
        "destroying WebSocketPipe with operation still in-progress; probably going to segfault") {
      // Don't std::terminate().
      break;
    }
  }